

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O1

void duckdb::RLEScanPartialInternal<long,true>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  data_ptr_t pdVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  RLEScanState<long> *scan_state;
  ulong uVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long *data_pointer;
  rle_count_t *index_pointer;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  scan_state = (RLEScanState<long> *)
               unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
               ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(scan_state->handle).node);
  pdVar1 = ((scan_state->handle).node.ptr)->buffer;
  data_pointer = (long *)(pdVar1 + segment->offset + 8);
  index_pointer = (rle_count_t *)(pdVar1 + (ulong)scan_state->rle_count_offset + segment->offset);
  if ((scan_count == 0x800) &&
     (0x7ff < (ulong)index_pointer[scan_state->entry_pos] - scan_state->position_in_entry)) {
    RLEScanConstant<long>(scan_state,index_pointer,data_pointer,0x800,result);
    return;
  }
  pdVar1 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  auVar4 = _DAT_01ddeb50;
  auVar3 = _DAT_01ddeb40;
  uVar8 = scan_count + result_offset;
  do {
    uVar5 = uVar8 - result_offset;
    if (uVar8 < result_offset || uVar5 == 0) {
      return;
    }
    uVar6 = (ulong)index_pointer[scan_state->entry_pos] - scan_state->position_in_entry;
    lVar2 = data_pointer[scan_state->entry_pos];
    if (uVar5 < uVar6) {
      lVar9 = uVar5 + (uVar5 == 0);
      lVar10 = lVar9 + -1;
      auVar13._8_4_ = (int)lVar10;
      auVar13._0_8_ = lVar10;
      auVar13._12_4_ = (int)((ulong)lVar10 >> 0x20);
      auVar13 = auVar13 ^ auVar4;
      uVar11 = 0;
      auVar14 = auVar3;
      do {
        auVar15 = auVar14 ^ auVar4;
        if ((bool)(~(auVar13._4_4_ < auVar15._4_4_ ||
                    auVar13._0_4_ < auVar15._0_4_ && auVar15._4_4_ == auVar13._4_4_) & 1)) {
          *(long *)(pdVar1 + uVar11 * 8 + result_offset * 8) = lVar2;
        }
        if (auVar15._12_4_ <= auVar13._12_4_ &&
            (auVar15._8_4_ <= auVar13._8_4_ || auVar15._12_4_ != auVar13._12_4_)) {
          *(long *)(pdVar1 + uVar11 * 8 + result_offset * 8 + 8) = lVar2;
        }
        uVar11 = uVar11 + 2;
        lVar10 = auVar14._8_8_;
        auVar14._0_8_ = auVar14._0_8_ + 2;
        auVar14._8_8_ = lVar10 + 2;
      } while ((lVar9 + 1U & 0xfffffffffffffffe) != uVar11);
      iVar7 = scan_state->position_in_entry + uVar5;
    }
    else {
      if ((ulong)index_pointer[scan_state->entry_pos] != scan_state->position_in_entry) {
        lVar9 = uVar6 - 1;
        auVar12._8_4_ = (int)lVar9;
        auVar12._0_8_ = lVar9;
        auVar12._12_4_ = (int)((ulong)lVar9 >> 0x20);
        auVar12 = auVar12 ^ auVar4;
        uVar11 = 0;
        auVar15 = auVar3;
        do {
          auVar14 = auVar15 ^ auVar4;
          if ((bool)(~(auVar12._4_4_ < auVar14._4_4_ ||
                      auVar12._0_4_ < auVar14._0_4_ && auVar14._4_4_ == auVar12._4_4_) & 1)) {
            *(long *)(pdVar1 + uVar11 * 8 + result_offset * 8) = lVar2;
          }
          if (auVar14._12_4_ <= auVar12._12_4_ &&
              (auVar14._8_4_ <= auVar12._8_4_ || auVar14._12_4_ != auVar12._12_4_)) {
            *(long *)(pdVar1 + uVar11 * 8 + result_offset * 8 + 8) = lVar2;
          }
          uVar11 = uVar11 + 2;
          lVar9 = auVar15._8_8_;
          auVar15._0_8_ = auVar15._0_8_ + 2;
          auVar15._8_8_ = lVar9 + 2;
        } while ((uVar6 + 1 & 0xfffffffffffffffe) != uVar11);
      }
      result_offset = result_offset + uVar6;
      scan_state->entry_pos = scan_state->entry_pos + 1;
      iVar7 = 0;
    }
    scan_state->position_in_entry = iVar7;
  } while (uVar6 <= uVar5);
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}